

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

bool LockDataDirectory(bool probeOnly)

{
  byte bVar1;
  LockResult LVar2;
  byte in_DIL;
  long in_FS_OFFSET;
  path *datadir;
  bilingual_str *in_stack_fffffffffffffe08;
  ArgsManager *in_stack_fffffffffffffe10;
  bilingual_str *in_stack_fffffffffffffe30;
  char *str;
  ConstevalStringLiteral str_00;
  undefined6 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  bilingual_str *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  bilingual_str *in_stack_fffffffffffffe88;
  char local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DIL & 1;
  str_00.lit = local_30;
  ArgsManager::GetDataDirNet(in_stack_fffffffffffffe10);
  fs::path::path((path *)0xfb2a32,(char *)in_stack_fffffffffffffe08);
  LVar2 = util::LockDirectory((path *)in_stack_fffffffffffffe88,(path *)in_stack_fffffffffffffe80,
                              (bool)in_stack_fffffffffffffe7f);
  fs::path::~path((path *)in_stack_fffffffffffffe08);
  if (LVar2 == Success) {
    bVar1 = 1;
  }
  else if (LVar2 == ErrorWrite) {
    _(str_00);
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffe10);
    tinyformat::format<std::__cxx11::string>
              (in_stack_fffffffffffffe68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe67,CONCAT16(bVar1,in_stack_fffffffffffffe60)));
    bVar1 = InitError(in_stack_fffffffffffffe30);
    bilingual_str::~bilingual_str(in_stack_fffffffffffffe08);
    std::__cxx11::string::~string(&in_stack_fffffffffffffe08->original);
    bilingual_str::~bilingual_str(in_stack_fffffffffffffe08);
  }
  else {
    if (LVar2 != ErrorLock) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
                    ,0x443,"bool LockDataDirectory(bool)");
    }
    str = "Cannot obtain a lock on data directory %s. %s is probably already running.";
    _(str_00);
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffe10);
    tinyformat::format<std::__cxx11::string,char[13]>
              (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (char (*) [13])CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    bVar1 = InitError((bilingual_str *)str);
    bilingual_str::~bilingual_str(in_stack_fffffffffffffe08);
    std::__cxx11::string::~string(&in_stack_fffffffffffffe08->original);
    bilingual_str::~bilingual_str(in_stack_fffffffffffffe08);
  }
  fs::path::~path((path *)in_stack_fffffffffffffe08);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

static bool LockDataDirectory(bool probeOnly)
{
    // Make sure only a single Bitcoin process is using the data directory.
    const fs::path& datadir = gArgs.GetDataDirNet();
    switch (util::LockDirectory(datadir, ".lock", probeOnly)) {
    case util::LockResult::ErrorWrite:
        return InitError(strprintf(_("Cannot write to data directory '%s'; check permissions."), fs::PathToString(datadir)));
    case util::LockResult::ErrorLock:
        return InitError(strprintf(_("Cannot obtain a lock on data directory %s. %s is probably already running."), fs::PathToString(datadir), PACKAGE_NAME));
    case util::LockResult::Success: return true;
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}